

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::makeAtomicStructSet<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  __index_type *__rhs;
  __index_type *p_Var1;
  HeapTypeT type_00;
  undefined1 local_e0 [8];
  Result<wasm::MemoryOrder> order;
  undefined1 local_98 [8];
  Result<wasm::Ok> _val_2;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT> type;
  Result<wasm::Ok> field;
  
  memorder<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::MemoryOrder> *)local_e0,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err> *)
             ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
             (_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err> *)local_e0);
  if (type.val.
      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      ._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string
              ((string *)
               ((long)&type.val.
                       super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
               + 0x20),(string *)
                       ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&type.val.
                       super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
               + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&type.val.
                       super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
               + 0x20));
    std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)
                      ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)
                      ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    typeidx<wasm::WATParser::ParseModuleTypesCtx>
              ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
    __rhs = (__index_type *)
            ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       *)((long)&type.val.
                                 super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         + 0x20),
                      (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       *)__rhs);
    if (field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                ((string *)local_98,
                 (string *)
                 ((long)&type.val.
                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                 + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_98);
      std::__cxx11::string::~string((string *)local_98);
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                           *)((long)&type.val.
                                     super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                             + 0x20));
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                           *)((long)&type.val.
                                     super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                             + 0x20));
      p_Var1 = (__index_type *)0x0;
      if (type.val.
          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
          .
          super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
          ._M_u._24_1_ == '\0') {
        p_Var1 = __rhs;
      }
      type_00.exactness = *(undefined4 *)(p_Var1 + 8);
      type_00.type.id =
           _val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
      type_00._12_4_ = 0;
      fieldidx<wasm::WATParser::ParseModuleTypesCtx>
                ((Result<wasm::Ok> *)
                 ((long)&type.val.
                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                 + 0x20),ctx,type_00);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_98,
                 (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&type.val.
                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                 + 0x20));
      if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&order.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),
                   (string *)local_98);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&order.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&order.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_98);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_98);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&type.val.
                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                 + 0x20));
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeAtomicStructSet(Ctx& ctx,
                             Index pos,
                             const std::vector<Annotation>& annotations) {
  auto order = memorder(ctx);
  CHECK_ERR(order);
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  auto field = fieldidx(ctx, *type);
  CHECK_ERR(field);
  return ctx.makeStructSet(pos, annotations, *type, *field, *order);
}